

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

UTrie2 * utrie2_cloneAsThawed_63(UTrie2 *other,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t local_38;
  ushort local_32;
  uint32_t value;
  UChar lead;
  NewTrieAndStatus context;
  UErrorCode *pErrorCode_local;
  UTrie2 *other_local;
  
  context._8_8_ = pErrorCode;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if ((other == (UTrie2 *)0x0) ||
       ((other->memory == (void *)0x0 && (other->newTrie == (UNewTrie2 *)0x0)))) {
      *(undefined4 *)context._8_8_ = 1;
      other_local = (UTrie2 *)0x0;
    }
    else if ((other->newTrie == (UNewTrie2 *)0x0) || (other->newTrie->isCompacted != '\0')) {
      _value = utrie2_open_63(other->initialValue,other->errorValue,(UErrorCode *)context._8_8_);
      UVar1 = U_FAILURE(*(UErrorCode *)context._8_8_);
      if (UVar1 == '\0') {
        context.trie._4_1_ = 0;
        context.trie._0_4_ = *(undefined4 *)context._8_8_;
        utrie2_enum_63(other,(UTrie2EnumValue *)0x0,copyEnumRange,&value);
        *(undefined4 *)context._8_8_ = context.trie._0_4_;
        for (local_32 = 0xd800; local_32 < 0xdc00; local_32 = local_32 + 1) {
          if (other->data32 == (uint32_t *)0x0) {
            local_38 = (uint32_t)
                       other->index
                       [(int)((uint)other->index[(int)(uint)local_32 >> 5] * 4 + (local_32 & 0x1f))]
            ;
          }
          else {
            local_38 = other->data32
                       [(int)((uint)other->index[(int)(uint)local_32 >> 5] * 4 + (local_32 & 0x1f))]
            ;
          }
          if (local_38 != other->initialValue) {
            utrie2_set32ForLeadSurrogateCodeUnit_63
                      (_value,(uint)local_32,local_38,(UErrorCode *)context._8_8_);
          }
        }
        UVar1 = U_FAILURE(*(UErrorCode *)context._8_8_);
        if (UVar1 != '\0') {
          utrie2_close_63(_value);
          _value = (UTrie2 *)0x0;
        }
        other_local = _value;
      }
      else {
        other_local = (UTrie2 *)0x0;
      }
    }
    else {
      other_local = utrie2_clone_63(other,(UErrorCode *)context._8_8_);
    }
  }
  else {
    other_local = (UTrie2 *)0x0;
  }
  return other_local;
}

Assistant:

U_CAPI UTrie2 * U_EXPORT2
utrie2_cloneAsThawed(const UTrie2 *other, UErrorCode *pErrorCode) {
    NewTrieAndStatus context;
    UChar lead;

    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if(other==NULL || (other->memory==NULL && other->newTrie==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    if(other->newTrie!=NULL && !other->newTrie->isCompacted) {
        return utrie2_clone(other, pErrorCode);  /* clone an unfrozen trie */
    }

    /* Clone the frozen trie by enumerating it and building a new one. */
    context.trie=utrie2_open(other->initialValue, other->errorValue, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    context.exclusiveLimit=FALSE;
    context.errorCode=*pErrorCode;
    utrie2_enum(other, NULL, copyEnumRange, &context);
    *pErrorCode=context.errorCode;
    for(lead=0xd800; lead<0xdc00; ++lead) {
        uint32_t value;
        if(other->data32==NULL) {
            value=UTRIE2_GET16_FROM_U16_SINGLE_LEAD(other, lead);
        } else {
            value=UTRIE2_GET32_FROM_U16_SINGLE_LEAD(other, lead);
        }
        if(value!=other->initialValue) {
            utrie2_set32ForLeadSurrogateCodeUnit(context.trie, lead, value, pErrorCode);
        }
    }
    if(U_FAILURE(*pErrorCode)) {
        utrie2_close(context.trie);
        context.trie=NULL;
    }
    return context.trie;
}